

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.cc
# Opt level: O0

void io::uci::parseGo(string *input,SearchInfo *info,Board *pos)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  undefined1 local_1f8 [8];
  string val;
  string key;
  istringstream ss;
  int local_34;
  int local_30;
  int movestogo;
  int movetime;
  int time;
  int depth;
  int inc;
  Board *pos_local;
  SearchInfo *info_local;
  string *input_local;
  
  time = 0;
  movetime = -1;
  movestogo = -1;
  local_30 = -1;
  local_34 = -1;
  std::__cxx11::istringstream::istringstream((istringstream *)((long)&key.field_2 + 8),input,8);
  std::__cxx11::string::string((string *)(val.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_1f8);
  while( true ) {
    piVar3 = std::operator>>((istream *)(key.field_2._M_local_buf + 8),
                             (string *)(val.field_2._M_local_buf + 8));
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&val.field_2 + 8),"depth");
    if (bVar1) {
      std::operator>>((istream *)(key.field_2._M_local_buf + 8),(string *)local_1f8);
      movetime = std::__cxx11::stoi((string *)local_1f8,(size_t *)0x0,10);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&val.field_2 + 8),"wtime");
      if ((bVar1) && (iVar2 = board::Board::getSide(pos), iVar2 == 0)) {
        std::operator>>((istream *)(key.field_2._M_local_buf + 8),(string *)local_1f8);
        movestogo = std::__cxx11::stoi((string *)local_1f8,(size_t *)0x0,10);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&val.field_2 + 8),"btime");
        if ((bVar1) && (iVar2 = board::Board::getSide(pos), iVar2 == 1)) {
          std::operator>>((istream *)(key.field_2._M_local_buf + 8),(string *)local_1f8);
          movestogo = std::__cxx11::stoi((string *)local_1f8,(size_t *)0x0,10);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&val.field_2 + 8),"winc");
          if ((bVar1) && (iVar2 = board::Board::getSide(pos), iVar2 == 0)) {
            std::operator>>((istream *)(key.field_2._M_local_buf + 8),(string *)local_1f8);
            time = std::__cxx11::stoi((string *)local_1f8,(size_t *)0x0,10);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&val.field_2 + 8),"binc");
            if ((bVar1) && (iVar2 = board::Board::getSide(pos), iVar2 == 1)) {
              std::operator>>((istream *)(key.field_2._M_local_buf + 8),(string *)local_1f8);
              time = std::__cxx11::stoi((string *)local_1f8,(size_t *)0x0,10);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&val.field_2 + 8),"movetime");
              if (bVar1) {
                std::operator>>((istream *)(key.field_2._M_local_buf + 8),(string *)local_1f8);
                local_30 = std::__cxx11::stoi((string *)local_1f8,(size_t *)0x0,10);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&val.field_2 + 8),"movestogo");
                if (bVar1) {
                  std::operator>>((istream *)(key.field_2._M_local_buf + 8),(string *)local_1f8);
                  local_34 = std::__cxx11::stoi((string *)local_1f8,(size_t *)0x0,10);
                }
              }
            }
          }
        }
      }
    }
  }
  search::SearchInfo::setStartTime(info);
  search::SearchInfo::setDepth(info,movetime);
  if (-1 < local_30) {
    movestogo = local_30;
    local_34 = 1;
  }
  if ((-1 < movestogo) && (0 < local_34)) {
    movestogo = movestogo / local_34;
  }
  search::SearchInfo::calculateStopTime(info,movestogo,time);
  search::go();
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
  std::__cxx11::istringstream::~istringstream((istringstream *)(key.field_2._M_local_buf + 8));
  return;
}

Assistant:

void io::uci::parseGo(const std::string& input, search::SearchInfo& info, board::Board& pos)
{
    int inc = 0;
    int depth = -1;
    int time = -1;
    int movetime = -1;
    int movestogo = -1;
    std::istringstream ss(input);
    std::string key;
    std::string val;
    while (ss >> key) {
        if (key == "depth") {
            ss >> val;
            depth = stoi(val);
        }
        else if (key == "wtime" && pos.getSide() == board::WHITE) {
            ss >> val;
            time = stoi(val);
        }
        else if (key == "btime" && pos.getSide() == board::BLACK) {
            ss >> val;
            time = stoi(val);
        }
        else if (key == "winc" && pos.getSide() == board::WHITE) {
            ss >> val;
            inc = stoi(val);
        }
        else if (key == "binc" && pos.getSide() == board::BLACK) {
            ss >> val;
            inc = stoi(val);
        }
        else if (key == "movetime") {
            ss >> val;
            movetime = stoi(val);
        }
        else if (key == "movestogo") {
            ss >> val;
            movestogo = stoi(val);
        }
    }
    info.setStartTime();
    info.setDepth(depth);
    if (movetime > -1) {
        time = movetime;
        movestogo = 1;
    }
    if (time > -1 && movestogo > 0) {
        time /= movestogo;
    }
    info.calculateStopTime(time, inc);
    search::go(pos, info);
}